

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O2

void CB_EXPLORE::get_cover_probabilities
               (cb_explore *data,single_learner *param_2,example *ec,
               v_array<ACTION_SCORE::action_score> *probs)

{
  undefined1 auVar1 [16];
  double dVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong i_00;
  uint32_t i;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  undefined4 in_XMM1_Db;
  action_score local_58;
  score_iterator local_50;
  score_iterator local_40;
  
  uVar3 = data->cover_size;
  v_array<unsigned_int>::clear(&data->preds);
  for (uVar6 = 0; uVar6 < (data->cbcs).num_actions; uVar6 = uVar6 + 1) {
    local_58.score = 0.0;
    local_58.action = uVar6;
    v_array<ACTION_SCORE::action_score>::push_back(probs,&local_58);
  }
  uVar5 = 0;
  while (uVar5 < data->cover_size) {
    i_00 = uVar5;
    if (uVar5 != 0) {
      i_00 = uVar5 + 1;
    }
    LEARNER::learner<CB_EXPLORE::cb_explore,_example>::predict(data->cs,ec,i_00);
    local_58.action = (ec->pred).multiclass;
    probs->_begin[local_58.action - 1].score =
         probs->_begin[local_58.action - 1].score + 1.0 / (float)uVar3;
    v_array<unsigned_int>::push_back(&data->preds,&local_58.action);
    uVar5 = uVar5 + 1;
  }
  uVar3 = (ulong)(data->cbcs).num_actions;
  fVar9 = (float)uVar3;
  lVar4 = uVar3 * data->counter;
  auVar7._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar7._0_8_ = lVar4;
  auVar7._12_4_ = 0x45300000;
  dVar2 = (auVar7._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
  auVar1._4_4_ = fVar9;
  auVar1._0_4_ = (float)SQRT(dVar2);
  auVar1._8_4_ = (int)((ulong)dVar2 >> 0x20);
  auVar1._12_4_ = in_XMM1_Db;
  auVar8 = divps(_DAT_0023fe70,auVar1);
  if (auVar8._4_4_ <= auVar8._0_4_) {
    auVar8._0_4_ = auVar8._4_4_;
  }
  local_40._p = probs->_begin;
  local_40._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_50._p = probs->_end;
  local_50._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
            (auVar8._0_4_ * fVar9,false,&local_40,&local_50);
  data->counter = data->counter + 1;
  return;
}

Assistant:

void get_cover_probabilities(cb_explore& data, single_learner& /* base */, example& ec, v_array<action_score>& probs)
{
  float additive_probability = 1.f / (float)data.cover_size;
  data.preds.clear();

  for (uint32_t i = 0; i < data.cbcs.num_actions; i++) probs.push_back({i, 0.});

  for (size_t i = 0; i < data.cover_size; i++)
  {
    // get predicted cost-sensitive predictions
    if (i == 0)
      data.cs->predict(ec, i);
    else
      data.cs->predict(ec, i + 1);
    uint32_t pred = ec.pred.multiclass;
    probs[pred - 1].score += additive_probability;
    data.preds.push_back((uint32_t)pred);
  }
  uint32_t num_actions = data.cbcs.num_actions;

  float min_prob = min(1.f / num_actions, 1.f / (float)sqrt(data.counter * num_actions));

  enforce_minimum_probability(min_prob * num_actions, false, begin_scores(probs), end_scores(probs));

  data.counter++;
}